

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlif.c
# Opt level: O0

void Io_ReadBlifFree(Io_ReadBlif_t *p)

{
  Io_ReadBlif_t *p_local;
  
  Extra_FileReaderFree(p->pReader);
  Vec_PtrFree(p->vNewTokens);
  Vec_StrFree(p->vCubes);
  Vec_IntFree(p->vInArrs);
  Vec_IntFree(p->vOutReqs);
  Vec_IntFree(p->vInDrives);
  Vec_IntFree(p->vOutLoads);
  if (p != (Io_ReadBlif_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Io_ReadBlifFree( Io_ReadBlif_t * p )
{
    Extra_FileReaderFree( p->pReader );
    Vec_PtrFree( p->vNewTokens );
    Vec_StrFree( p->vCubes );
    Vec_IntFree( p->vInArrs );
    Vec_IntFree( p->vOutReqs );
    Vec_IntFree( p->vInDrives );
    Vec_IntFree( p->vOutLoads );
    ABC_FREE( p );
}